

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::~HttpInputStreamImpl(HttpInputStreamImpl *this)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&this->messageReadQueue);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&(this->onMessageDone).ptr);
  if (((this->resumingRequest).ptr.isSet == true) &&
     ((this->resumingRequest).ptr.field_1.value.tag - 1 < 2)) {
    (this->resumingRequest).ptr.field_1.value.tag = 0;
  }
  HttpHeaders::~HttpHeaders(&this->headers);
  Array<char>::~Array(&this->headerBuffer);
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::~WrappableStreamMixin
            (&this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>);
  return;
}

Assistant:

static kj::OneOf<HttpHeaders::Request, HttpHeaders::ConnectRequest> getResumingRequest(
      kj::OneOf<HttpMethod, HttpConnectMethod> method,
      kj::StringPtr url) {
    KJ_SWITCH_ONEOF(method) {
      KJ_CASE_ONEOF(m, HttpMethod) {
        return HttpHeaders::Request { m, url };
      }
      KJ_CASE_ONEOF(m, HttpConnectMethod) {
        return HttpHeaders::ConnectRequest { url };
      }
    }
    KJ_UNREACHABLE;
  }